

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

bool __thiscall
Test::Suite::run(Suite *this,Output *out,
                vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods
                ,bool continueOnError)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  duration<long,_std::ratio<1L,_1000000L>_> dVar4;
  TestMethod *method_00;
  __shared_ptr_access<Test::Suite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar5;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> pVar6;
  shared_ptr<Test::Suite> *suite;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_> *__range1;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> result;
  reference_wrapper<const_Test::Suite::TestMethod> *method;
  iterator __end2;
  iterator __begin2;
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  *__range2;
  undefined1 local_40 [8];
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  selectedTestMethods;
  bool continueOnError_local;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods_local;
  Output *out_local;
  Suite *this_local;
  
  selectedTestMethods.
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = continueOnError;
  filterTests((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
               *)local_40,this,selectedMethods);
  this->continueAfterFail =
       (bool)(selectedTestMethods.
              super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
  this->output = out;
  sVar3 = std::
          vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
          ::size((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                  *)local_40);
  (*out->_vptr_Output[2])(out,&this->suiteName,sVar3 & 0xffffffff);
  dVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::zero();
  (this->totalDuration).__r = dVar4.__r;
  this->positiveTestMethods = 0;
  uVar2 = (*this->_vptr_Suite[5])();
  if ((uVar2 & 1) != 0) {
    __end2 = std::
             vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
             ::begin((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                      *)local_40);
    method = (reference_wrapper<const_Test::Suite::TestMethod> *)
             std::
             vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
             ::end((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                    *)local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::reference_wrapper<const_Test::Suite::TestMethod>_*,_std::vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>_>
                                       *)&method), bVar1) {
      result.second.__r =
           (rep)__gnu_cxx::
                __normal_iterator<std::reference_wrapper<const_Test::Suite::TestMethod>_*,_std::vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>_>
                ::operator*(&__end2);
      method_00 = std::reference_wrapper<const_Test::Suite::TestMethod>::get
                            ((reference_wrapper<const_Test::Suite::TestMethod> *)result.second.__r);
      pVar6 = runTestMethod(this,method_00);
      result._0_8_ = pVar6.second.__r;
      std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator+=
                (&this->totalDuration,(duration<long,_std::ratio<1L,_1000000L>_> *)&result);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->positiveTestMethods = this->positiveTestMethods + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<const_Test::Suite::TestMethod>_*,_std::vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>_>
      ::operator++(&__end2);
    }
    (*this->_vptr_Suite[6])();
  }
  sVar3 = std::
          vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
          ::size((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                  *)local_40);
  (*out->_vptr_Output[3])
            (out,&this->suiteName,sVar3 & 0xffffffff,(ulong)this->positiveTestMethods,
             (this->totalDuration).__r);
  __end1 = std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
           ::begin(&this->subSuites);
  suite = (shared_ptr<Test::Suite> *)
          std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
          ::end(&this->subSuites);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
                                     *)&suite), bVar1) {
    this_00 = (__shared_ptr_access<Test::Suite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
              ::operator*(&__end1);
    peVar5 = std::__shared_ptr_access<Test::Suite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar5->_vptr_Suite[3])(peVar5,out,selectedMethods,(ulong)(this->continueAfterFail & 1));
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Test::Suite>_*,_std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>_>
    ::operator++(&__end1);
  }
  uVar2 = this->positiveTestMethods;
  sVar3 = std::
          vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
          ::size((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
                  *)local_40);
  std::
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::~vector((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
             *)local_40);
  return uVar2 == sVar3;
}

Assistant:

bool Suite::run(Output &out, const std::vector<TestMethodInfo> &selectedMethods, bool continueOnError) {
  auto selectedTestMethods = filterTests(selectedMethods);

  this->continueAfterFail = continueOnError;
  this->output = &out;
  out.initializeSuite(suiteName, static_cast<unsigned>(selectedTestMethods.size()));
  // run tests
  totalDuration = std::chrono::microseconds::zero();
  positiveTestMethods = 0;
  // run setup before all tests
  if (setup()) {
    for (const auto &method : selectedTestMethods) {
      std::pair<bool, std::chrono::microseconds> result = runTestMethod(method.get());
      totalDuration += result.second;
      if (result.first)
        ++positiveTestMethods;
    }
    // run tear-down after all tests
    tear_down();
  }
  out.finishSuite(suiteName, static_cast<unsigned>(selectedTestMethods.size()), positiveTestMethods, totalDuration);

  // run sub-suites
  for (std::shared_ptr<Test::Suite> &suite : subSuites) {
    suite->run(out, selectedMethods, continueAfterFail);
  }

  return positiveTestMethods == selectedTestMethods.size();
}